

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

int __thiscall
FIX::DataDictionary::lookupXMLFieldNumber(DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode)

{
  int iVar1;
  pointer pDVar2;
  ConfigError *this_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  string name;
  DOMAttributesPtr attrs;
  DOMNode *pNode_local;
  DOMDocument *pDoc_local;
  DataDictionary *this_local;
  
  (*pNode->_vptr_DOMNode[4])();
  std::__cxx11::string::string((string *)local_48);
  pDVar2 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&name.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"name",&local_69);
  iVar1 = (*pDVar2->_vptr_DOMAttributes[2])(pDVar2,local_68,local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    iVar1 = lookupXMLFieldNumber(this,pDoc,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
              ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
               ((long)&name.field_2 + 8));
    return iVar1;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"No name given to field",&local_a1);
  ConfigError::ConfigError(this_00,&local_a0);
  __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

int DataDictionary::lookupXMLFieldNumber(DOMDocument *pDoc, DOMNode *pNode) const {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to field");
  }
  return lookupXMLFieldNumber(pDoc, name);
}